

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
::
ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::AlgebraicConHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           *this)

{
  bool bVar1;
  uint lb;
  int iVar2;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *in_RDI;
  int num_terms;
  int index;
  AlgebraicConHandler lh;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffe4;
  uint in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  LinearExprBuilder in_stack_fffffffffffffff0;
  
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  ::AlgebraicConHandler::AlgebraicConHandler
            ((AlgebraicConHandler *)in_RDI,
             (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  ::AlgebraicConHandler::num_items((AlgebraicConHandler *)&stack0xfffffffffffffff0);
  lb = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       ::ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                   *)in_stack_fffffffffffffff0.expr_,in_stack_ffffffffffffffec);
  iVar2 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          ::ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                      *)in_stack_fffffffffffffff0.expr_,lb,in_stack_ffffffffffffffe8);
  BinaryReaderBase::ReadTillEndOfLine
            ((BinaryReaderBase *)
             ((ItemHandler<(mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::ItemType)2>
               *)&in_RDI->reader_)->reader_);
  bVar1 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          ::AlgebraicConHandler::SkipExpr((AlgebraicConHandler *)&stack0xfffffffffffffff0,lb);
  if (bVar1) {
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
    ::ReadLinearExpr<mp::internal::NullLinearExprHandler>(in_RDI,iVar2);
  }
  else {
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
    ::AlgebraicConHandler::OnLinearExpr
              ((AlgebraicConHandler *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),0,0x2b1de0);
    ReadLinearExpr<mp::BasicProblem<mp::BasicProblemParams<int>>::LinearExprBuilder>
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                *)CONCAT44(lb,iVar2),in_stack_ffffffffffffffe4,in_stack_fffffffffffffff0);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr() {
  LinearHandler lh(*this);
  int index = ReadUInt(lh.num_items());
  // The number of terms should be less than num_vars because common
  // expressions are not allowed in a linear expression.
  int num_terms = ReadUInt(1, header_.num_vars + 1u);
  reader_.ReadTillEndOfLine();
  if (lh.SkipExpr(index))
    ReadLinearExpr(num_terms, NullLinearExprHandler());
  else
    ReadLinearExpr(num_terms, lh.OnLinearExpr(index, num_terms));
}